

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
               (Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs,
               Matrix<float,__1,_1,_0,__1,_1> *rhs,Matrix<float,__1,_1,_0,__1,_1> *dest,
               Scalar *alpha)

{
  long lVar1;
  float *ptr;
  size_t size;
  Index rows;
  TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *pTVar2;
  Index cols;
  EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *this;
  ulong uVar3;
  Scalar *pSVar4;
  Index IVar5;
  Index resIncr;
  Scalar **ppSVar6;
  Scalar SVar7;
  Scalar SVar8;
  float alpha_00;
  Scalar *local_1c8;
  float *local_1c0;
  size_t local_1b8;
  Index local_1b0;
  TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *local_1a8;
  Index local_1a0;
  Scalar *local_198;
  float *local_190;
  Scalar *local_188;
  Scalar *local_180;
  float local_178;
  float local_174;
  BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true> local_170;
  const_blas_data_mapper<float,_long,_0> local_138 [2];
  const_blas_data_mapper<float,_long,_1> local_118;
  undefined1 local_108 [8];
  aligned_stack_memory_handler<float> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  gemv_static_vector_if<float,__1,__1,_false> static_rhs;
  ResScalar actualAlpha;
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Matrix<float,__1,_1,_0,__1,_1> *dest_local;
  Matrix<float,__1,_1,_0,__1,_1> *rhs_local;
  Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs_local;
  
  ppSVar6 = &local_1c8;
  actualLhs.m_matrix = (non_const_type)alpha;
  actualRhs = (type)blas_traits<Eigen::Transpose<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::
                    extract(lhs);
  this = (EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
         blas_traits<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::extract(rhs);
  local_178 = *(float *)&((actualLhs.m_matrix)->
                         super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                         m_data;
  SVar7 = blas_traits<Eigen::Transpose<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::
          extractScalarFactor(lhs);
  local_174 = local_178 * SVar7;
  SVar8 = blas_traits<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::extractScalarFactor(rhs);
  alpha_00 = local_174 * SVar8;
  uVar3 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size(this);
  if (0x3fffffffffffffff < uVar3) {
    throw_std_bad_alloc();
  }
  pSVar4 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                     ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)this);
  if (pSVar4 == (Scalar *)0x0) {
    IVar5 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size(this);
    if ((ulong)(IVar5 * 4) < 0x20001) {
      IVar5 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size(this);
      lVar1 = -(IVar5 * 4 + 0x1eU & 0xfffffffffffffff0);
      ppSVar6 = (Scalar **)((long)&local_1c8 + lVar1);
      local_188 = (Scalar *)((long)&local_1c0 + lVar1);
    }
    else {
      IVar5 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size(this);
      local_188 = (Scalar *)aligned_malloc(IVar5 << 2);
    }
    local_180 = local_188;
  }
  else {
    local_180 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                          ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)this);
    ppSVar6 = &local_1c8;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_180;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c78d;
  pSVar4 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                     ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)this);
  if (pSVar4 == (Scalar *)0x0) {
    local_190 = (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_190 = (float *)0x0;
  }
  local_1c0 = local_190;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c7c8;
  local_1b8 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size(this);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c7db;
  IVar5 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size(this);
  size = local_1b8;
  ptr = local_1c0;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c805;
  aligned_stack_memory_handler<float>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_108,ptr,size,0x20000 < (ulong)(IVar5 << 2)
            );
  local_1a8 = (TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *)
              &actualRhs;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c818;
  local_1b0 = Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&actualRhs);
  pTVar2 = local_1a8;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c82b;
  local_1a0 = Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)pTVar2);
  pTVar2 = local_1a8;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c83e;
  local_198 = TransposeImpl<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::data
                        (pTVar2);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c853;
  local_118.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_stride =
       TransposeImpl<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::outerStride
                 ((TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *)
                  &actualRhs);
  local_118.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_data = local_198;
  local_138[0].super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
       (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  local_138[0].super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = 1;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c965;
  local_1c8 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                        (&dest->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c985;
  DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::col
            ((ColXpr *)&local_170,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)dest,0);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c993;
  resIncr = BlockImpl_dense<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_true,_true>::innerStride
                      (&local_170);
  cols = local_1a0;
  rows = local_1b0;
  pSVar4 = local_1c8;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c9c6;
  general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
  ::run(rows,cols,&local_118,local_138,pSVar4,resIncr,alpha_00);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23c9d4;
  aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_108);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }